

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O1

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') {
    Extend();
  }
  puVar7 = (uint *)(data + n);
  uVar14 = ~crc;
  puVar3 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar9 = (uint *)data;
  if ((long)puVar3 - (long)data != 0 && puVar3 <= puVar7) {
    do {
      puVar10 = (uint *)((long)puVar9 + 1);
      uVar14 = uVar14 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*puVar9 ^ uVar14 & 0xff) * 4);
      puVar9 = puVar10;
    } while (puVar10 != puVar3);
    data = data + ((long)puVar3 - (long)data);
  }
  if (0xf < (long)puVar7 - (long)data) {
    uVar14 = uVar14 ^ *(uint *)data;
    uVar2 = *(uint *)((long)data + 4);
    uVar4 = *(uint *)((long)data + 8);
    uVar5 = *(uint *)((long)data + 0xc);
    data = (char *)((long)data + 0x10);
    for (lVar11 = (long)puVar7 - (long)data; 0xf < lVar11; lVar11 = lVar11 + -0x10) {
      uVar14 = *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar14 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar14 & 0xff) * 4)
               ^ *(uint *)data ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar14 >> 0xe & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar14 >> 0x18) * 4
                        );
      uVar2 = *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar2 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar2 & 0xff) * 4) ^
              *(uint *)((long)data + 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar2 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar2 >> 0x18) * 4);
      uVar4 = *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar4 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar4 & 0xff) * 4) ^
              *(uint *)((long)data + 8) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar4 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar4 >> 0x18) * 4);
      uVar5 = *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)((long)data + 0xc) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4);
      data = (char *)((long)data + 0x10);
    }
    for (lVar11 = (long)puVar7 - (long)data; 3 < lVar11; lVar11 = lVar11 + -4) {
      uVar12 = uVar14 & 0xff;
      uVar6 = uVar14 >> 8;
      uVar13 = uVar14 >> 0xe;
      uVar8 = uVar14 >> 0x18;
      uVar1 = *(uint *)data;
      data = (char *)((long)data + 4);
      uVar14 = uVar2;
      uVar2 = uVar4;
      uVar4 = uVar5;
      uVar5 = *(uint *)((anonymous_namespace)::kStrideExtensionTable2 + (ulong)(uVar6 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar12 * 4) ^ uVar1 ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar13 & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar8 * 4);
    }
    lVar11 = 4;
    do {
      uVar14 = uVar14 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + ((ulong)uVar14 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar14 = uVar14 ^ uVar2;
    lVar11 = 4;
    do {
      uVar14 = uVar14 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar14 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar14 = uVar14 ^ uVar4;
    lVar11 = 4;
    do {
      uVar14 = uVar14 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar14 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar14 = uVar14 ^ uVar5;
    lVar11 = 4;
    do {
      uVar14 = uVar14 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar14 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  for (; (uint *)data != puVar7; data = (char *)((long)data + 1)) {
    uVar14 = uVar14 >> 8 ^
             *(uint *)((anonymous_namespace)::kByteExtensionTable +
                      (ulong)((uint)(byte)*(uint *)data ^ uVar14 & 0xff) * 4);
  }
  return ~uVar14;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}